

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Value * json_object_getn_value(JSON_Object *object,char *name,size_t name_len)

{
  undefined8 in_RAX;
  unsigned_long hash;
  size_t sVar1;
  JSON_Value *pJVar2;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT71((int7)((ulong)in_RAX >> 8),object == (JSON_Object *)0x0);
  if (name != (char *)0x0 && object != (JSON_Object *)0x0) {
    hash = hash_string(name,name_len);
    uStack_28 = uStack_28 & 0xffffffff;
    sVar1 = json_object_get_cell_ix
                      (object,name,name_len,hash,(parson_bool_t *)((long)&uStack_28 + 4));
    if (uStack_28._4_4_ == 0) {
      pJVar2 = (JSON_Value *)0x0;
    }
    else {
      pJVar2 = object->values[object->cells[sVar1]];
    }
    return pJVar2;
  }
  return (JSON_Value *)0x0;
}

Assistant:

static JSON_Value * json_object_getn_value(const JSON_Object *object, const char *name, size_t name_len) {
    unsigned long hash = 0;
    parson_bool_t found = PARSON_FALSE;
    size_t cell_ix = 0;
    size_t item_ix = 0;
    if (!object || !name) {
        return NULL;
    }
    hash = hash_string(name, name_len);
    found = PARSON_FALSE;
    cell_ix = json_object_get_cell_ix(object, name, name_len, hash, &found);
    if (!found) {
        return NULL;
    }
    item_ix = object->cells[cell_ix];
    return object->values[item_ix];
}